

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O1

void __thiscall wallet::CWallet::~CWallet(CWallet *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~CWallet(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x4a8);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CWallet()
    {
        // Should not have slots connected at this point.
        assert(NotifyUnload.empty());
    }